

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O3

string * benchmark::anon_unknown_1::FormatKV
                   (string *__return_storage_ptr__,string *key,int64_t value)

{
  ostream *poVar1;
  string *psVar2;
  stringstream ss;
  char local_1a1;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a1 = '\"';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_190,&local_1a1,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(key->_M_dataplus)._M_p,key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\": ",3);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  psVar2 = (string *)std::ios_base::~ios_base(local_120);
  return psVar2;
}

Assistant:

std::string FormatKV(std::string const& key, int64_t value) {
  std::stringstream ss;
  ss << '"' << key << "\": " << value;
  return ss.str();
}